

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<std::pair<QString,QString>>>
          (QtPrivate *this,QDebug debug,char *which,QList<std::pair<QString,_QString>_> *c)

{
  qsizetype *pqVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  QDebug *pQVar5;
  pair<QString,_QString> *ppVar6;
  pair<QString,_QString> *pair;
  QDebug debug_00;
  pair<QString,_QString> *ppVar7;
  long in_FS_OFFSET;
  undefined1 local_60 [16];
  Data *local_50;
  Stream local_48 [8];
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  ppVar7 = (c->d).ptr;
  lVar3 = (c->d).size;
  ppVar6 = ppVar7 + lVar3;
  if (lVar3 == 0) goto LAB_00206018;
  local_50 = *(Data **)debug.stream;
  pair = (pair<QString,_QString> *)&local_50;
  pqVar1 = &local_50[2].super_QArrayData.alloc;
  *(int *)pqVar1 = (int)*pqVar1 + 1;
  debug_00.stream = local_48;
  while( true ) {
    ::operator<<(debug_00,pair);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)pair);
    ppVar7 = ppVar7 + 1;
LAB_00206018:
    if (ppVar7 == ppVar6) break;
    pQVar5 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60._0_8_ = pQVar5->stream;
    pair = (pair<QString,_QString> *)local_60;
    *(int *)(local_60._0_8_ + 0x28) = *(int *)(local_60._0_8_ + 0x28) + 1;
    debug_00.stream = (Stream *)(local_60 + 8);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}